

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_rsn(REF_GRID ref_grid,REF_INT node,REF_DBL *r,REF_DBL *s,REF_DBL *n)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell_00;
  uint uVar2;
  REF_INT local_11c;
  double local_118;
  REF_INT local_110;
  int local_10c;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dr [3];
  REF_DBL dot;
  REF_DBL small_dot;
  REF_INT local_c8;
  REF_INT cell_node;
  REF_INT nodes [27];
  REF_INT local_50;
  int local_4c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *n_local;
  REF_DBL *s_local;
  REF_DBL *r_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  *r = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  dot = 2.0;
  ref_grid_local._4_4_ = ref_recon_normal(ref_grid,node,n);
  if (ref_grid_local._4_4_ == 0) {
    if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
      local_10c = -1;
    }
    else {
      local_10c = ref_cell_00->ref_adj->first[node];
    }
    local_4c = local_10c;
    if (local_10c == -1) {
      local_110 = -1;
    }
    else {
      local_110 = ref_cell_00->ref_adj->item[local_10c].ref;
    }
    local_50 = local_110;
    while (local_4c != -1) {
      uVar2 = ref_cell_nodes(ref_cell_00,local_50,&local_c8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x5de,"ref_recon_rsn",(ulong)uVar2,"cell nodes");
        return uVar2;
      }
      for (small_dot._4_4_ = 0; small_dot._4_4_ < ref_cell_00->node_per;
          small_dot._4_4_ = small_dot._4_4_ + 1) {
        if (node != (&local_c8)[small_dot._4_4_]) {
          _ref_private_macro_code_rss_1 =
               pRVar1->real[(&local_c8)[small_dot._4_4_] * 0xf] - pRVar1->real[node * 0xf];
          dr[0] = pRVar1->real[(&local_c8)[small_dot._4_4_] * 0xf + 1] -
                  pRVar1->real[node * 0xf + 1];
          dr[1] = pRVar1->real[(&local_c8)[small_dot._4_4_] * 0xf + 2] -
                  pRVar1->real[node * 0xf + 2];
          uVar2 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x5e7,"ref_recon_rsn",(ulong)uVar2,"norm dr");
            return uVar2;
          }
          if (dr[1] * n[2] + _ref_private_macro_code_rss_1 * *n + dr[0] * n[1] <= 0.0) {
            local_118 = -(dr[1] * n[2] + _ref_private_macro_code_rss_1 * *n + dr[0] * n[1]);
          }
          else {
            local_118 = dr[1] * n[2] + _ref_private_macro_code_rss_1 * *n + dr[0] * n[1];
          }
          dr[2] = local_118;
          if (local_118 < dot) {
            dot = local_118;
            *r = _ref_private_macro_code_rss_1;
            r[1] = dr[0];
            r[2] = dr[1];
          }
        }
      }
      local_4c = ref_cell_00->ref_adj->item[local_4c].next;
      if (local_4c == -1) {
        local_11c = -1;
      }
      else {
        local_11c = ref_cell_00->ref_adj->item[local_4c].ref;
      }
      local_50 = local_11c;
    }
    dr[2] = r[2] * n[2] + *r * *n + r[1] * n[1];
    *r = -dr[2] * *n + *r;
    r[1] = -dr[2] * n[1] + r[1];
    r[2] = -dr[2] * n[2] + r[2];
    ref_grid_local._4_4_ = ref_math_normalize(r);
    if (ref_grid_local._4_4_ == 0) {
      *s = n[1] * r[2] + -(n[2] * r[1]);
      s[1] = n[2] * *r + -(*n * r[2]);
      s[2] = *n * r[1] + -(n[1] * *r);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5f7
             ,"ref_recon_rsn",(ulong)ref_grid_local._4_4_,"norm r");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5dc,
           "ref_recon_rsn",(ulong)ref_grid_local._4_4_,"norm");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn(REF_GRID ref_grid, REF_INT node, REF_DBL *r,
                                 REF_DBL *s, REF_DBL *n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_DBL small_dot, dot;
  REF_DBL dr[3];

  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;

  small_dot = 2.0;
  RSS(ref_recon_normal(ref_grid, node, n), "norm");
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      if (node != nodes[cell_node]) {
        dr[0] = ref_node_xyz(ref_node, 0, nodes[cell_node]) -
                ref_node_xyz(ref_node, 0, node);
        dr[1] = ref_node_xyz(ref_node, 1, nodes[cell_node]) -
                ref_node_xyz(ref_node, 1, node);
        dr[2] = ref_node_xyz(ref_node, 2, nodes[cell_node]) -
                ref_node_xyz(ref_node, 2, node);
        RSS(ref_math_normalize(dr), "norm dr");
        dot = ABS(ref_math_dot(dr, n));
        if (dot < small_dot) {
          small_dot = dot;
          r[0] = dr[0];
          r[1] = dr[1];
          r[2] = dr[2];
        }
      }
    }
  }

  dot = ref_math_dot(r, n);
  r[0] -= dot * n[0];
  r[1] -= dot * n[1];
  r[2] -= dot * n[2];
  RSS(ref_math_normalize(r), "norm r");

  ref_math_cross_product(n, r, s);

  return REF_SUCCESS;
}